

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

MessageLite *
google::protobuf::internal::GetOwnedMessageInternal
          (Arena *message_arena,MessageLite *submessage,Arena *submessage_arena)

{
  Arena *pAVar1;
  MessageLite *this;
  Nonnull<const_char_*> pcVar2;
  internal aiStack_28 [16];
  
  pAVar1 = (Arena *)(submessage->_internal_metadata_).ptr_;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar1 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  if (pAVar1 == submessage_arena) {
    if (submessage_arena == message_arena) goto LAB_00fd131a;
    if (submessage_arena == (Arena *)0x0) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
      goto LAB_00fd12ae;
    }
  }
  else {
    GetOwnedMessageInternal(aiStack_28);
LAB_00fd131a:
    GetOwnedMessageInternal(aiStack_28);
  }
  pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                     (submessage_arena,(void *)0x0,"submessage_arena == nullptr");
LAB_00fd12ae:
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (message_arena == (Arena *)0x0 || submessage_arena != (Arena *)0x0) {
      this = MessageLite::New(submessage,message_arena);
      MessageLite::CheckTypeAndMergeFrom(this,submessage);
    }
    else {
      this = submessage;
      if (submessage != (MessageLite *)0x0) {
        ThreadSafeArena::AddCleanup
                  (&message_arena->impl_,submessage,
                   arena_delete_object<google::protobuf::MessageLite>);
      }
    }
    return this;
  }
  GetOwnedMessageInternal();
}

Assistant:

MessageLite* GetOwnedMessageInternal(Arena* message_arena,
                                     MessageLite* submessage,
                                     Arena* submessage_arena) {
  ABSL_DCHECK(submessage->GetArena() == submessage_arena);
  ABSL_DCHECK(message_arena != submessage_arena);
  ABSL_DCHECK_EQ(submessage_arena, nullptr);
  if (message_arena != nullptr && submessage_arena == nullptr) {
    message_arena->Own(submessage);
    return submessage;
  } else {
    MessageLite* ret = submessage->New(message_arena);
    ret->CheckTypeAndMergeFrom(*submessage);
    return ret;
  }
}